

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

RegistryHub ** Catch::anon_unknown_22::getTheRegistryHub(void)

{
  _Rb_tree_header *p_Var1;
  RegistryHub **in_RAX;
  
  if (getTheRegistryHub::theRegistryHub != (RegistryHub *)0x0) {
    return in_RAX;
  }
  getTheRegistryHub::theRegistryHub = (RegistryHub *)operator_new(0xd8);
  (getTheRegistryHub::theRegistryHub->super_IRegistryHub)._vptr_IRegistryHub =
       (_func_int **)&PTR__RegistryHub_0016e210;
  (getTheRegistryHub::theRegistryHub->super_IMutableRegistryHub)._vptr_IMutableRegistryHub =
       (_func_int **)&PTR__RegistryHub_0016e260;
  (getTheRegistryHub::theRegistryHub->m_testCaseRegistry).super_ITestCaseRegistry.
  _vptr_ITestCaseRegistry = (_func_int **)&PTR__TestRegistry_0016d3f0;
  p_Var1 = &(getTheRegistryHub::theRegistryHub->m_testCaseRegistry).m_functions._M_t._M_impl.
            super__Rb_tree_header;
  (getTheRegistryHub::theRegistryHub->m_testCaseRegistry).m_functions._M_t._M_impl.
  super__Rb_tree_header._M_header._M_color = _S_red;
  (getTheRegistryHub::theRegistryHub->m_testCaseRegistry).m_functions._M_t._M_impl.
  super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (getTheRegistryHub::theRegistryHub->m_testCaseRegistry).m_functions._M_t._M_impl.
  super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (getTheRegistryHub::theRegistryHub->m_testCaseRegistry).m_functions._M_t._M_impl.
  super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (getTheRegistryHub::theRegistryHub->m_testCaseRegistry).m_functions._M_t._M_impl.
  super__Rb_tree_header._M_node_count = 0;
  (getTheRegistryHub::theRegistryHub->m_testCaseRegistry).m_functionsInOrder.
  super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (getTheRegistryHub::theRegistryHub->m_testCaseRegistry).m_functionsInOrder.
  super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (getTheRegistryHub::theRegistryHub->m_testCaseRegistry).m_functionsInOrder.
  super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (getTheRegistryHub::theRegistryHub->m_testCaseRegistry).m_nonHiddenFunctions.
  super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (getTheRegistryHub::theRegistryHub->m_testCaseRegistry).m_nonHiddenFunctions.
  super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (getTheRegistryHub::theRegistryHub->m_testCaseRegistry).m_nonHiddenFunctions.
  super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (getTheRegistryHub::theRegistryHub->m_testCaseRegistry).m_unnamedCount = 0;
  (getTheRegistryHub::theRegistryHub->m_reporterRegistry).super_IReporterRegistry.
  _vptr_IReporterRegistry = (_func_int **)&PTR__ReporterRegistry_0016e448;
  p_Var1 = &(getTheRegistryHub::theRegistryHub->m_reporterRegistry).m_factories._M_t._M_impl.
            super__Rb_tree_header;
  (getTheRegistryHub::theRegistryHub->m_reporterRegistry).m_factories._M_t._M_impl.
  super__Rb_tree_header._M_header._M_color = _S_red;
  (getTheRegistryHub::theRegistryHub->m_reporterRegistry).m_factories._M_t._M_impl.
  super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (getTheRegistryHub::theRegistryHub->m_reporterRegistry).m_factories._M_t._M_impl.
  super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (getTheRegistryHub::theRegistryHub->m_reporterRegistry).m_factories._M_t._M_impl.
  super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (getTheRegistryHub::theRegistryHub->m_reporterRegistry).m_factories._M_t._M_impl.
  super__Rb_tree_header._M_node_count = 0;
  (getTheRegistryHub::theRegistryHub->m_exceptionTranslatorRegistry).
  super_IExceptionTranslatorRegistry._vptr_IExceptionTranslatorRegistry =
       (_func_int **)&PTR__ExceptionTranslatorRegistry_0016e490;
  (getTheRegistryHub::theRegistryHub->m_exceptionTranslatorRegistry).m_translators.
  super__Vector_base<const_Catch::IExceptionTranslator_*,_std::allocator<const_Catch::IExceptionTranslator_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (getTheRegistryHub::theRegistryHub->m_exceptionTranslatorRegistry).m_translators.
  super__Vector_base<const_Catch::IExceptionTranslator_*,_std::allocator<const_Catch::IExceptionTranslator_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (getTheRegistryHub::theRegistryHub->m_exceptionTranslatorRegistry).m_translators.
  super__Vector_base<const_Catch::IExceptionTranslator_*,_std::allocator<const_Catch::IExceptionTranslator_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return (RegistryHub **)getTheRegistryHub::theRegistryHub;
}

Assistant:

inline RegistryHub*& getTheRegistryHub() {
            static RegistryHub* theRegistryHub = NULL;
            if( !theRegistryHub )
                theRegistryHub = new RegistryHub();
            return theRegistryHub;
        }